

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O0

void __thiscall
dlib::array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_>::set_max_size
          (array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> *this,size_t max)

{
  unsigned_long *puVar1;
  long in_RSI;
  long *in_RDI;
  unsigned_long *in_stack_ffffffffffffffc8;
  memory_manager_stateless_kernel_1<unsigned_long> *in_stack_ffffffffffffffd0;
  
  (**(code **)(*in_RDI + 0x18))();
  in_RDI[2] = 0;
  in_RDI[6] = 0;
  if (in_RSI == 0) {
    if (in_RDI[4] != 0) {
      memory_manager_stateless_kernel_1<unsigned_long>::deallocate_array
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    in_RDI[3] = 0;
    in_RDI[4] = 0;
  }
  else if (in_RSI != in_RDI[3]) {
    if (in_RDI[4] != 0) {
      memory_manager_stateless_kernel_1<unsigned_long>::deallocate_array
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    puVar1 = memory_manager_stateless_kernel_1<unsigned_long>::allocate_array
                       (in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    in_RDI[4] = (long)puVar1;
    in_RDI[3] = in_RSI;
  }
  return;
}

Assistant:

void array<T,mem_manager>::
    set_max_size(
        size_t max
    )
    {
        reset();
        array_size = 0;
        last_pos = 0;
        if (max != 0)
        {
            // if new max size is different
            if (max != max_array_size)
            {
                if (array_elements)
                {
                    pool.deallocate_array(array_elements);
                }
                // try to get more memroy
                try { array_elements = pool.allocate_array(max); }
                catch (...) { array_elements = 0;  max_array_size = 0; throw; }
                max_array_size = max;
            }

        }
        // if the array is being made to be zero
        else
        {
            if (array_elements)
                pool.deallocate_array(array_elements);
            max_array_size = 0;
            array_elements = 0;
        }
    }